

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::
optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  value_type *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      pvVar1 = operator*(other);
      std::__cxx11::string::operator=((string *)&this->contained,(string *)pvVar1);
    }
  }
  else if (other->has_value_ != false) {
    pvVar1 = operator*(other);
    optional<std::__cxx11::string>::initialize<std::__cxx11::string>
              ((optional<std::__cxx11::string> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar1);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }